

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  int iVar1;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  sqlite3VdbeMemSetNull((Mem *)0x13e889);
  iVar1 = sqlite3IsNaN((double)in_RDI);
  if (iVar1 == 0) {
    *in_RDI = in_XMM0_Qa;
    *(undefined2 *)((long)in_RDI + 0x14) = 8;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  sqlite3VdbeMemSetNull(pMem);
  if( !sqlite3IsNaN(val) ){
    pMem->u.r = val;
    pMem->flags = MEM_Real;
  }
}